

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::state::encode_eob
          (state *this,symbol_codec *codec,search_accelerator *dict,uint dict_pos)

{
  char cVar1;
  undefined1 uVar2;
  uint uVar3;
  
  uVar3 = (uint)codec;
  cVar1 = lzham::symbol_codec::encode
                    (uVar3,(adaptive_bit_model *)0x1,
                     (bool)((char)this + '$' + (char)(this->super_state_base).m_cur_state * '\x02'))
  ;
  if (cVar1 != '\0') {
    cVar1 = lzham::symbol_codec::encode
                      (uVar3,(adaptive_bit_model *)0x0,
                       (bool)((char)this + (char)(this->super_state_base).m_cur_state * '\x02' + '<'
                             ));
    if (cVar1 != '\0') {
      uVar2 = lzham::symbol_codec::encode(uVar3,(quasi_adaptive_huffman_data_model *)0x0);
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool lzcompressor::state::encode_eob(symbol_codec& codec, const search_accelerator& dict, uint dict_pos)
   {
      LZHAM_NOTE_UNUSED(dict);
      LZHAM_NOTE_UNUSED(dict_pos);

#ifdef LZHAM_LZDEBUG
      if (!codec.encode_bits(CLZBase::cLZHAMDebugSyncMarkerValue, CLZBase::cLZHAMDebugSyncMarkerBits)) 
      {
         LZHAM_LOG_ERROR(8047);
         return false;
      }
      if (!codec.encode_bits(1, 1)) 
      {
         LZHAM_LOG_ERROR(8048);
         return false;
      }
      if (!codec.encode_bits(0, 17)) 
      {
         LZHAM_LOG_ERROR(8049);
         return false;
      }
      if (!codec.encode_bits(m_cur_state, 4)) 
      {
         LZHAM_LOG_ERROR(8050);
         return false;
      }
#endif

      //const uint match_pred = get_pred_char(dict, dict_pos, 1);
      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(m_cur_state);
      if (!codec.encode(1, m_is_match_model[is_match_model_index])) 
      {
         LZHAM_LOG_ERROR(8051);
         return false;
      }

      // full match
      if (!codec.encode(0, m_is_rep_model[m_cur_state])) 
      {
         LZHAM_LOG_ERROR(8052);     
         return false;
      }

      return codec.encode(CLZBase::cLZXSpecialCodeEndOfBlockCode, m_main_table);
   }